

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O1

Type * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::GetMapValueType
          (Node *this,Type *found_type,TypeInfo *typeinfo)

{
  string *psVar1;
  pointer pcVar2;
  size_t size;
  Type *pTVar3;
  LogMessage *pLVar4;
  int iVar5;
  int index;
  LogMessage local_b8;
  int local_80 [2];
  StatusOr<const_google::protobuf::Type_*> sub_type;
  Type *local_48;
  LogFinisher local_31;
  
  index = 0;
  if ((found_type->fields_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    local_48 = (Type *)0x0;
  }
  else {
    sub_type.value_ = (Type *)typeinfo;
    do {
      pTVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::Field>::TypeHandler>
                         (&(found_type->fields_).super_RepeatedPtrFieldBase,index);
      iVar5 = 4;
      if ((pTVar3->number_ == 2) && (iVar5 = 2, pTVar3->kind_ == 0xb)) {
        psVar1 = (pTVar3->type_url_).ptr_;
        pcVar2 = (psVar1->_M_dataplus)._M_p;
        size = psVar1->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
        }
        (*((sub_type.value_)->super_Message).super_MessageLite._vptr_MessageLite[2])
                  (local_80,sub_type.value_,pcVar2,size);
        if (local_80[0] == 0) {
          iVar5 = 1;
          local_48 = (Type *)sub_type.status_.error_message_.field_2._8_8_;
        }
        else {
          protobuf::internal::LogMessage::LogMessage
                    (&local_b8,LOGLEVEL_WARNING,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/internal/default_value_objectwriter.cc"
                     ,0x123);
          pLVar4 = protobuf::internal::LogMessage::operator<<(&local_b8,"Cannot resolve type \'");
          pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,(pTVar3->type_url_).ptr_);
          pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,"\'.");
          protobuf::internal::LogFinisher::operator=(&local_31,pLVar4);
          protobuf::internal::LogMessage::~LogMessage(&local_b8);
          iVar5 = 2;
        }
        if ((size_type *)sub_type.status_._0_8_ != &sub_type.status_.error_message_._M_string_length
           ) {
          operator_delete((void *)sub_type.status_._0_8_);
        }
      }
      if (iVar5 != 4) goto LAB_00314758;
      index = index + 1;
    } while (index < (found_type->fields_).super_RepeatedPtrFieldBase.current_size_);
    iVar5 = 2;
LAB_00314758:
    if (iVar5 == 2) {
      local_48 = (Type *)0x0;
    }
  }
  return local_48;
}

Assistant:

const google::protobuf::Type* DefaultValueObjectWriter::Node::GetMapValueType(
    const google::protobuf::Type& found_type, const TypeInfo* typeinfo) {
  // If this field is a map, we should use the type of its "Value" as
  // the type of the child node.
  for (int i = 0; i < found_type.fields_size(); ++i) {
    const google::protobuf::Field& sub_field = found_type.fields(i);
    if (sub_field.number() != 2) {
      continue;
    }
    if (sub_field.kind() != google::protobuf::Field::TYPE_MESSAGE) {
      // This map's value type is not a message type. We don't need to
      // get the field_type in this case.
      break;
    }
    util::StatusOr<const google::protobuf::Type*> sub_type =
        typeinfo->ResolveTypeUrl(sub_field.type_url());
    if (!sub_type.ok()) {
      GOOGLE_LOG(WARNING) << "Cannot resolve type '" << sub_field.type_url() << "'.";
    } else {
      return sub_type.value();
    }
    break;
  }
  return nullptr;
}